

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_htime_item(archive_read *a,char unix_time,uint64_t *where,ssize_t *extra_data_size)

{
  wchar_t wVar1;
  uint64_t uVar2;
  uint64_t local_40;
  uint64_t windows_time;
  ssize_t *psStack_30;
  uint32_t time_val;
  ssize_t *extra_data_size_local;
  uint64_t *where_local;
  archive_read *paStack_18;
  char unix_time_local;
  archive_read *a_local;
  
  psStack_30 = extra_data_size;
  extra_data_size_local = (ssize_t *)where;
  where_local._7_1_ = unix_time;
  paStack_18 = a;
  if (unix_time == '\0') {
    wVar1 = read_u64(a,&local_40);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    uVar2 = time_win_to_unix(local_40);
    *extra_data_size_local = uVar2;
    *psStack_30 = *psStack_30 + -8;
  }
  else {
    wVar1 = read_u32(a,(uint32_t *)((long)&windows_time + 4));
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    *psStack_30 = *psStack_30 + -4;
    *extra_data_size_local = (ulong)windows_time._4_4_;
  }
  return L'\0';
}

Assistant:

static int parse_htime_item(struct archive_read* a, char unix_time,
    uint64_t* where, ssize_t* extra_data_size)
{
	if(unix_time) {
		uint32_t time_val;
		if(!read_u32(a, &time_val))
			return ARCHIVE_EOF;

		*extra_data_size -= 4;
		*where = (uint64_t) time_val;
	} else {
		uint64_t windows_time;
		if(!read_u64(a, &windows_time))
			return ARCHIVE_EOF;

		*where = time_win_to_unix(windows_time);
		*extra_data_size -= 8;
	}

	return ARCHIVE_OK;
}